

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::frame(Console *this)

{
  int iVar1;
  Console *in_RDI;
  Console *unaff_retaddr;
  int frame;
  undefined4 in_stack_fffffffffffffff0;
  
  do {
    iVar1 = step(unaff_retaddr);
  } while (in_RDI->prev_frame == iVar1);
  in_RDI->prev_frame = iVar1;
  getAPU(in_RDI);
  APU::step((APU *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  getAPU(in_RDI);
  APU::stepFrame((APU *)0x1174ab);
  return;
}

Assistant:

void Console::frame() {
    int frame = 0;

    do {
        frame = step();
    } while (prev_frame == frame);

    prev_frame = frame;

    getAPU()->step();
    getAPU()->stepFrame();
}